

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall cmCacheManager::DeleteCache(cmCacheManager *this,string *path)

{
  bool bVar1;
  string cacheFile;
  string cmakeFiles;
  string sStack_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_48);
  std::__cxx11::string::string((string *)&local_28,(string *)&sStack_48);
  std::__cxx11::string::append((char *)&sStack_48);
  bVar1 = cmsys::SystemTools::FileExists(&sStack_48);
  if (bVar1) {
    cmsys::SystemTools::RemoveFile(&sStack_48);
    std::__cxx11::string::append((char *)&local_28);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&local_28);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&local_28);
    }
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&sStack_48);
  return true;
}

Assistant:

bool cmCacheManager::DeleteCache(const std::string& path)
{
  std::string cacheFile = path;
  cmSystemTools::ConvertToUnixSlashes(cacheFile);
  std::string cmakeFiles = cacheFile;
  cacheFile += "/CMakeCache.txt";
  if (cmSystemTools::FileExists(cacheFile)) {
    cmSystemTools::RemoveFile(cacheFile);
    // now remove the files in the CMakeFiles directory
    // this cleans up language cache files
    cmakeFiles += "/CMakeFiles";
    if (cmSystemTools::FileIsDirectory(cmakeFiles)) {
      cmSystemTools::RemoveADirectory(cmakeFiles);
    }
  }
  return true;
}